

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void glob_verifyquit(void *dummy,t_floatarg f)

{
  _glist *p_Var1;
  _glist *x;
  _glist *x_00;
  t_symbol *ptVar2;
  char *msg;
  t_atom backmsg [2];
  char buf [40];
  
  msg = "really quit?";
  for (p_Var1 = pd_getcanvaslist(); p_Var1 != (_glist *)0x0; p_Var1 = p_Var1->gl_next) {
    x = glist_finddirty(p_Var1);
    if (x != (_glist *)0x0) {
      sprintf(buf,".x%lx",x);
      backmsg[0].a_type = A_SYMBOL;
      backmsg[0].a_w.w_symbol = gensym("menuclose");
      backmsg[1].a_type = A_FLOAT;
      backmsg[1].a_w.w_index = 0x40400000;
      canvas_vis(x,1.0);
      p_Var1 = canvas_getrootfor(x_00);
      ptVar2 = gensym(buf);
      pdgui_vmess("pdtk_canvas_menuclose","^m",p_Var1,ptVar2,2,backmsg);
      return;
    }
  }
  if (((f == 0.0) && (!NAN(f))) && (sys_perf != 0)) {
    pdgui_vmess("pdtk_check","r Sss",".pdwindow",1,&msg,"pd quit","yes");
    return;
  }
  glob_quit((void *)0x0);
  return;
}

Assistant:

void glob_verifyquit(void *dummy, t_floatarg f)
{
    t_glist *g, *g2;
    const char*msg = "really quit?";
        /* find all root canvases */
    for (g = pd_getcanvaslist(); g; g = g->gl_next)
        if ((g2 = glist_finddirty(g)))
        {
            t_atom backmsg[2];
            char buf[40];
            sprintf(buf, ".x%lx", g2);
            SETSYMBOL(backmsg+0, gensym("menuclose"));
            SETFLOAT (backmsg+1, 3);

            canvas_vis(g2, 1);
            pdgui_vmess("pdtk_canvas_menuclose", "^m",
                        canvas_getrootfor(g),
                        gensym(buf), 2, backmsg);
            return;
        }
    if (f == 0 && sys_perf)
        pdgui_vmess("pdtk_check", "r Sss",
            ".pdwindow",
            1, &msg,
            "pd quit", "yes");
    else glob_quit(0);
}